

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAppendList.hpp
# Opt level: O2

void __thiscall
de::AppendList<vk::DebugReportMessage>::~AppendList(AppendList<vk::DebugReportMessage> *this)

{
  Block *pBVar1;
  ulong uVar2;
  Block *delBlock;
  Block *this_00;
  ulong uVar3;
  
  uVar3 = 0;
  this_00 = this->m_first;
  while (this_00 != (Block *)0x0) {
    pBVar1 = this_00->next;
    while( true ) {
      uVar2 = (this_00->blockNdx + 1) * this->m_blockSize;
      if (this->m_numElements < uVar2) {
        uVar2 = this->m_numElements;
      }
      if (uVar2 <= uVar3) break;
      ::vk::DebugReportMessage::~DebugReportMessage(this_00->elements + uVar3 % this->m_blockSize);
      uVar3 = uVar3 + 1;
    }
    Block::~Block(this_00);
    operator_delete(this_00,0x18);
    this_00 = pBVar1;
  }
  return;
}

Assistant:

AppendList<ElementType>::~AppendList (void)
{
	size_t	elementNdx	= 0;
	Block*	curBlock	= m_first;

	while (curBlock)
	{
		Block* const	delBlock	= curBlock;

		curBlock = delBlock->next;

		// Call destructor for allocated elements
		for (; elementNdx < min(m_numElements, (delBlock->blockNdx+1)*m_blockSize); ++elementNdx)
			delBlock->elements[elementNdx%m_blockSize].~ElementType();

		delete delBlock;
	}

	DE_ASSERT(elementNdx == m_numElements);
}